

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void P_TraceBleed(int damage,FTranslatedLineTarget *t,AActor *puff)

{
  AActor *actor;
  int iVar1;
  DAngle local_38;
  DAngle local_30;
  DVector3 local_28;
  
  if ((t->linetarget != (AActor *)0x0) && (((puff->flags3).Value & 0x8000000) == 0)) {
    iVar1 = FRandom::operator()(&pr_tracebleed);
    local_38.Degrees = (double)(iVar1 + -0x80) * 0.0054931640625;
    actor = t->linetarget;
    local_28.Z = actor->Height * 0.5 + (actor->__Pos).Z;
    local_28.X = (actor->__Pos).X;
    local_28.Y = (actor->__Pos).Y;
    local_30.Degrees = (t->angleFromSource).Degrees;
    P_TraceBleed(damage,&local_28,actor,&local_30,&local_38);
  }
  return;
}

Assistant:

void P_TraceBleed(int damage, FTranslatedLineTarget *t, AActor *puff)
{
	if (t->linetarget == NULL || puff->flags3 & MF3_BLOODLESSIMPACT)
	{
		return;
	}

	DAngle pitch = (pr_tracebleed() - 128) * (360 / 65536.);
	P_TraceBleed(damage, t->linetarget->PosPlusZ(t->linetarget->Height/2), t->linetarget, t->angleFromSource, pitch);
}